

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualModel.cpp
# Opt level: O1

void __thiscall
chrono::ChVisualModel::Update(ChVisualModel *this,ChPhysicsItem *owner,ChFrame<double> *frame)

{
  pointer ppVar1;
  element_type *peVar2;
  pointer psVar3;
  ChVisualShapeFEA *this_00;
  shared_ptr<chrono::ChVisualShapeFEA> *shapeFEA;
  pointer psVar4;
  pair<std::shared_ptr<chrono::ChVisualShape>,_chrono::ChFrame<double>_> *shape;
  pointer ppVar5;
  vector<std::pair<std::shared_ptr<chrono::ChVisualShape>,_chrono::ChFrame<double>_>,_std::allocator<std::pair<std::shared_ptr<chrono::ChVisualShape>,_chrono::ChFrame<double>_>_>_>
  *__range1;
  ChFrame<double> xform;
  ChQuaternion<double> local_d8;
  ChFrame<double> local_b8;
  
  ppVar5 = (this->m_shapes).
           super__Vector_base<std::pair<std::shared_ptr<chrono::ChVisualShape>,_chrono::ChFrame<double>_>,_std::allocator<std::pair<std::shared_ptr<chrono::ChVisualShape>,_chrono::ChFrame<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->m_shapes).
           super__Vector_base<std::pair<std::shared_ptr<chrono::ChVisualShape>,_chrono::ChFrame<double>_>,_std::allocator<std::pair<std::shared_ptr<chrono::ChVisualShape>,_chrono::ChFrame<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar5 != ppVar1) {
    do {
      ChFrame<double>::operator>>(&local_b8,frame,&ppVar5->second);
      peVar2 = (ppVar5->first).super___shared_ptr<chrono::ChVisualShape,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      (*peVar2->_vptr_ChVisualShape[2])(peVar2,owner,&local_b8);
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != ppVar1);
  }
  psVar3 = (this->m_shapesFEA).
           super__Vector_base<std::shared_ptr<chrono::ChVisualShapeFEA>,_std::allocator<std::shared_ptr<chrono::ChVisualShapeFEA>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->m_shapesFEA).
                super__Vector_base<std::shared_ptr<chrono::ChVisualShapeFEA>,_std::allocator<std::shared_ptr<chrono::ChVisualShapeFEA>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar3; psVar4 = psVar4 + 1) {
    this_00 = (psVar4->super___shared_ptr<chrono::ChVisualShapeFEA,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    local_d8.m_data[0] = 1.0;
    local_d8.m_data[3] = 0.0;
    local_d8.m_data[1] = 0.0;
    local_d8.m_data[2] = 0.0;
    local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
    local_b8.coord.pos.m_data[2] = 0.0;
    local_b8.coord.pos.m_data[0] = 0.0;
    local_b8.coord.pos.m_data[1] = 0.0;
    local_b8.coord.rot.m_data[0] = 1.0;
    local_b8.coord.rot.m_data[3] = 0.0;
    local_b8.coord.rot.m_data[1] = 0.0;
    local_b8.coord.rot.m_data[2] = 0.0;
    ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,&local_d8);
    ChVisualShapeFEA::Update(this_00,owner,&local_b8);
  }
  return;
}

Assistant:

void ChVisualModel::Update(ChPhysicsItem* owner, const ChFrame<>& frame) {
    for (auto& shape : m_shapes) {
        auto xform = frame >> shape.second;
        shape.first->Update(owner, xform);
    }
    for (auto& shapeFEA : m_shapesFEA) {
        shapeFEA->Update(owner, ChFrame<>());
    }
}